

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O3

st__retval stPathTableDdFree(char *key,char *value,char *arg)

{
  if (*(DdNode **)(value + 0x10) != (DdNode *)0x0) {
    Cudd_RecursiveDeref((DdManager *)arg,*(DdNode **)(value + 0x10));
  }
  if (*(DdNode **)(value + 0x18) != (DdNode *)0x0) {
    Cudd_RecursiveDeref((DdManager *)arg,*(DdNode **)(value + 0x18));
  }
  return st__CONTINUE;
}

Assistant:

static enum st__retval
stPathTableDdFree(
  char * key,
  char * value,
  char * arg)
{
    NodeDist_t *nodeStat;
    DdManager *dd;

    nodeStat = (NodeDist_t *)value;
    dd = (DdManager *)arg;
    if (nodeStat->regResult != NULL) {
        Cudd_RecursiveDeref(dd, nodeStat->regResult);
    }
    if (nodeStat->compResult != NULL) {
        Cudd_RecursiveDeref(dd, nodeStat->compResult);
    }
    return( st__CONTINUE);

}